

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O2

void LoadReverbPreset(char *name,ALeffect *effect)

{
  undefined8 uVar1;
  float fVar2;
  anon_struct_140_2_2091dbc6 *paVar3;
  int iVar4;
  uint type;
  char *__format;
  long lVar5;
  anon_struct_140_2_2091dbc6 *__s2;
  
  iVar4 = al::strcasecmp(name,"NONE");
  if (iVar4 == 0) {
    anon_unknown.dwarf_22f89::InitEffectParams(effect,0);
    if (2 < (int)gLogLevel) {
      __format = "[ALSOFT] (II) Loading reverb \'%s\'\n";
      name = "NONE";
LAB_0011c26c:
      fprintf((FILE *)gLogFile,__format,name);
      return;
    }
  }
  else {
    type = 0x8000;
    if (DisabledEffects[0] != false) {
      type = DisabledEffects[1] ^ 1;
    }
    anon_unknown.dwarf_22f89::InitEffectParams(effect,type);
    lVar5 = 0x3dcc;
    paVar3 = reverblist;
    do {
      __s2 = paVar3;
      if (lVar5 == 0) {
        if ((int)gLogLevel < 2) {
          return;
        }
        __format = "[ALSOFT] (WW) Reverb preset \'%s\' not found\n";
        goto LAB_0011c26c;
      }
      iVar4 = al::strcasecmp(name,__s2->name);
      lVar5 = lVar5 + -0x8c;
      paVar3 = __s2 + 1;
    } while (iVar4 != 0);
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Loading reverb \'%s\'\n",__s2);
    }
    fVar2 = (__s2->props).flDiffusion;
    uVar1 = *(undefined8 *)&(__s2->props).flGain;
    *(int *)&effect->Props = (int)(__s2->props).flDensity;
    *(float *)((long)&effect->Props + 4) = fVar2;
    *(undefined8 *)((long)&effect->Props + 8) = uVar1;
    (effect->Props).Reverb.GainLF = (__s2->props).flGainLF;
    *(undefined8 *)((long)&effect->Props + 0x10) = *(undefined8 *)&(__s2->props).flDecayTime;
    (effect->Props).Reverb.DecayLFRatio = (__s2->props).flDecayLFRatio;
    *(undefined8 *)((long)&effect->Props + 0x18) = *(undefined8 *)&(__s2->props).flReflectionsGain;
    *(undefined8 *)((long)&effect->Props + 0x3c) = *(undefined8 *)(__s2->props).flReflectionsPan;
    (effect->Props).Reverb.ReflectionsPan[2] = (__s2->props).flReflectionsPan[2];
    *(undefined8 *)((long)&effect->Props + 0x20) = *(undefined8 *)&(__s2->props).flLateReverbGain;
    uVar1 = *(undefined8 *)((__s2->props).flLateReverbPan + 2);
    *(undefined8 *)((long)&effect->Props + 0x48) = *(undefined8 *)(__s2->props).flLateReverbPan;
    *(undefined8 *)((long)&effect->Props + 0x50) = uVar1;
    *(undefined8 *)((long)&effect->Props + 0x58) = *(undefined8 *)&(__s2->props).flEchoDepth;
    (effect->Props).Reverb.ModulationDepth = (__s2->props).flModulationDepth;
    (effect->Props).Reverb.AirAbsorptionGainHF = (__s2->props).flAirAbsorptionGainHF;
    *(undefined8 *)((long)&effect->Props + 100) = *(undefined8 *)&(__s2->props).flHFReference;
    (effect->Props).Reverb.RoomRolloffFactor = (__s2->props).flRoomRolloffFactor;
    (effect->Props).Reverb.DecayHFLimit = (__s2->props).iDecayHFLimit != 0;
  }
  return;
}

Assistant:

void LoadReverbPreset(const char *name, ALeffect *effect)
{
    if(al::strcasecmp(name, "NONE") == 0)
    {
        InitEffectParams(effect, AL_EFFECT_NULL);
        TRACE("Loading reverb '%s'\n", "NONE");
        return;
    }

    if(!DisabledEffects[EAXREVERB_EFFECT])
        InitEffectParams(effect, AL_EFFECT_EAXREVERB);
    else if(!DisabledEffects[REVERB_EFFECT])
        InitEffectParams(effect, AL_EFFECT_REVERB);
    else
        InitEffectParams(effect, AL_EFFECT_NULL);
    for(const auto &reverbitem : reverblist)
    {
        const EFXEAXREVERBPROPERTIES *props;

        if(al::strcasecmp(name, reverbitem.name) != 0)
            continue;

        TRACE("Loading reverb '%s'\n", reverbitem.name);
        props = &reverbitem.props;
        effect->Props.Reverb.Density   = props->flDensity;
        effect->Props.Reverb.Diffusion = props->flDiffusion;
        effect->Props.Reverb.Gain   = props->flGain;
        effect->Props.Reverb.GainHF = props->flGainHF;
        effect->Props.Reverb.GainLF = props->flGainLF;
        effect->Props.Reverb.DecayTime    = props->flDecayTime;
        effect->Props.Reverb.DecayHFRatio = props->flDecayHFRatio;
        effect->Props.Reverb.DecayLFRatio = props->flDecayLFRatio;
        effect->Props.Reverb.ReflectionsGain   = props->flReflectionsGain;
        effect->Props.Reverb.ReflectionsDelay  = props->flReflectionsDelay;
        effect->Props.Reverb.ReflectionsPan[0] = props->flReflectionsPan[0];
        effect->Props.Reverb.ReflectionsPan[1] = props->flReflectionsPan[1];
        effect->Props.Reverb.ReflectionsPan[2] = props->flReflectionsPan[2];
        effect->Props.Reverb.LateReverbGain   = props->flLateReverbGain;
        effect->Props.Reverb.LateReverbDelay  = props->flLateReverbDelay;
        effect->Props.Reverb.LateReverbPan[0] = props->flLateReverbPan[0];
        effect->Props.Reverb.LateReverbPan[1] = props->flLateReverbPan[1];
        effect->Props.Reverb.LateReverbPan[2] = props->flLateReverbPan[2];
        effect->Props.Reverb.EchoTime  = props->flEchoTime;
        effect->Props.Reverb.EchoDepth = props->flEchoDepth;
        effect->Props.Reverb.ModulationTime  = props->flModulationTime;
        effect->Props.Reverb.ModulationDepth = props->flModulationDepth;
        effect->Props.Reverb.AirAbsorptionGainHF = props->flAirAbsorptionGainHF;
        effect->Props.Reverb.HFReference = props->flHFReference;
        effect->Props.Reverb.LFReference = props->flLFReference;
        effect->Props.Reverb.RoomRolloffFactor = props->flRoomRolloffFactor;
        effect->Props.Reverb.DecayHFLimit = props->iDecayHFLimit ? AL_TRUE : AL_FALSE;
        return;
    }

    WARN("Reverb preset '%s' not found\n", name);
}